

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSocket.cpp
# Opt level: O0

void __thiscall brynet::net::DataSocket::normalFlush(DataSocket *this)

{
  bool bVar1;
  sock __fd;
  int iVar2;
  long *plVar3;
  void *pvVar4;
  undefined8 *puVar5;
  size_t *psVar6;
  long lVar7;
  long lVar8;
  pointer this_00;
  ssize_t sVar9;
  int *piVar10;
  const_iterator local_138;
  iterator local_118;
  reference local_f8;
  pending_packet *packet_1;
  undefined1 local_d0 [8];
  iterator it_1;
  size_t tmp_len;
  undefined1 local_a0 [4];
  int send_retlen;
  _Map_pointer local_80;
  size_t packetLeftLen;
  char *packetLeftBuf;
  pending_packet *packet;
  undefined1 local_48 [8];
  iterator it;
  size_t wait_send_size;
  char *sendptr;
  bool must_close;
  DataSocket *this_local;
  
  plVar3 = (long *)__tls_get_addr(&PTR_001fdf70);
  if (*plVar3 == 0) {
    pvVar4 = malloc(0x8000);
    puVar5 = (undefined8 *)__tls_get_addr(&PTR_001fdf70);
    *puVar5 = pvVar4;
  }
  sendptr._7_1_ = 0;
  do {
    bVar1 = std::
            deque<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
            ::empty(&this->mSendList);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_001805c7;
    psVar6 = (size_t *)__tls_get_addr(&PTR_001fdf70);
    wait_send_size = *psVar6;
    it._M_node = (_Map_pointer)0x0;
    std::
    deque<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
    ::begin((iterator *)local_48,&this->mSendList);
    while( true ) {
      std::
      deque<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
      ::end((iterator *)&packet,&this->mSendList);
      bVar1 = std::operator!=((_Self *)local_48,(_Self *)&packet);
      if (!bVar1) break;
      packetLeftBuf =
           (char *)std::
                   _Deque_iterator<brynet::net::DataSocket::pending_packet,_brynet::net::DataSocket::pending_packet_&,_brynet::net::DataSocket::pending_packet_*>
                   ::operator*((_Deque_iterator<brynet::net::DataSocket::pending_packet,_brynet::net::DataSocket::pending_packet_&,_brynet::net::DataSocket::pending_packet_*>
                                *)local_48);
      std::
      __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)packetLeftBuf);
      lVar7 = std::__cxx11::string::c_str();
      std::
      __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)packetLeftBuf);
      lVar8 = std::__cxx11::string::size();
      packetLeftLen = lVar7 + (lVar8 - *(long *)(packetLeftBuf + 0x10));
      local_80 = *(_Map_pointer *)(packetLeftBuf + 0x10);
      if (0x8000 < (ulong)((long)it._M_node + (long)local_80)) {
        std::
        deque<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
        ::begin((iterator *)local_a0,&this->mSendList);
        bVar1 = std::operator==((_Self *)local_48,(_Self *)local_a0);
        if (bVar1) {
          wait_send_size = packetLeftLen;
          it._M_node = local_80;
        }
        break;
      }
      memcpy((void *)(wait_send_size + (long)it._M_node),(void *)packetLeftLen,(size_t)local_80);
      it._M_node = (_Map_pointer)((long)local_80 + (long)it._M_node);
      std::
      _Deque_iterator<brynet::net::DataSocket::pending_packet,_brynet::net::DataSocket::pending_packet_&,_brynet::net::DataSocket::pending_packet_*>
      ::operator++((_Deque_iterator<brynet::net::DataSocket::pending_packet,_brynet::net::DataSocket::pending_packet_&,_brynet::net::DataSocket::pending_packet_*>
                    *)local_48);
    }
    if (it._M_node == (_Map_pointer)0x0) goto LAB_001805c7;
    this_00 = std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>::
              operator->(&this->mSocket);
    __fd = TcpSocket::getFD(this_00);
    sVar9 = ::send(__fd,(void *)wait_send_size,(long)(int)it._M_node,0);
    iVar2 = (int)sVar9;
    if (iVar2 < 1) {
      piVar10 = __errno_location();
      if (*piVar10 == 0xb) {
        this->mCanWrite = false;
        bVar1 = checkWrite(this);
        sendptr._7_1_ = (bVar1 ^ 0xffU) & 1;
      }
      else {
        sendptr._7_1_ = 1;
      }
      goto LAB_001805c7;
    }
    it_1._M_node = (_Map_pointer)(long)iVar2;
    std::
    deque<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
    ::begin((iterator *)local_d0,&this->mSendList);
    while( true ) {
      std::
      deque<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
      ::end((iterator *)&packet_1,&this->mSendList);
      bVar1 = std::operator!=((_Self *)local_d0,(_Self *)&packet_1);
      if (!bVar1) break;
      local_f8 = std::
                 _Deque_iterator<brynet::net::DataSocket::pending_packet,_brynet::net::DataSocket::pending_packet_&,_brynet::net::DataSocket::pending_packet_*>
                 ::operator*((_Deque_iterator<brynet::net::DataSocket::pending_packet,_brynet::net::DataSocket::pending_packet_&,_brynet::net::DataSocket::pending_packet_*>
                              *)local_d0);
      if (it_1._M_node < (_Map_pointer)local_f8->left) {
        local_f8->left = local_f8->left - (long)it_1._M_node;
        break;
      }
      it_1._M_node = (_Map_pointer)((long)it_1._M_node - local_f8->left);
      bVar1 = std::operator!=(&local_f8->mCompleteCallback,(nullptr_t)0x0);
      if (bVar1) {
        std::function<void_()>::operator()(&local_f8->mCompleteCallback);
      }
      std::
      _Deque_iterator<brynet::net::DataSocket::pending_packet,brynet::net::DataSocket::pending_packet_const&,brynet::net::DataSocket::pending_packet_const*>
      ::
      _Deque_iterator<std::_Deque_iterator<brynet::net::DataSocket::pending_packet,brynet::net::DataSocket::pending_packet&,brynet::net::DataSocket::pending_packet*>,void>
                ((_Deque_iterator<brynet::net::DataSocket::pending_packet,brynet::net::DataSocket::pending_packet_const&,brynet::net::DataSocket::pending_packet_const*>
                  *)&local_138,
                 (_Deque_iterator<brynet::net::DataSocket::pending_packet,_brynet::net::DataSocket::pending_packet_&,_brynet::net::DataSocket::pending_packet_*>
                  *)local_d0);
      std::
      deque<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
      ::erase(&local_118,&this->mSendList,&local_138);
    }
  } while ((_Map_pointer)(long)iVar2 == it._M_node);
  this->mCanWrite = false;
  bVar1 = checkWrite(this);
  sendptr._7_1_ = (bVar1 ^ 0xffU) & 1;
LAB_001805c7:
  if (sendptr._7_1_ != 0) {
    procCloseInLoop(this);
  }
  return;
}

Assistant:

void DataSocket::normalFlush()
{
    static  const   int SENDBUF_SIZE = 1024 * 32;
    if (threadLocalSendBuf == nullptr)
    {
        threadLocalSendBuf = (char*)malloc(SENDBUF_SIZE);
    }

    bool must_close = false;

    while (!mSendList.empty())
    {
        char* sendptr = threadLocalSendBuf;
        size_t     wait_send_size = 0;

        for (auto it = mSendList.begin(); it != mSendList.end(); ++it)
        {
            auto& packet = *it;
            auto packetLeftBuf = (char*)(packet.data->c_str() + (packet.data->size() - packet.left));
            auto packetLeftLen = packet.left;

            if ((wait_send_size + packetLeftLen) > SENDBUF_SIZE)
            {
                if (it == mSendList.begin())
                {
                    sendptr = packetLeftBuf;
                    wait_send_size = packetLeftLen;
                }
                break;
            }

            memcpy(sendptr + wait_send_size, packetLeftBuf, packetLeftLen);
            wait_send_size += packetLeftLen;
        }

        if (wait_send_size <= 0)
        {
            break;
        }

        int send_retlen = 0;
#ifdef USE_OPENSSL
        if (mSSL != nullptr)
        {
            send_retlen = SSL_write(mSSL, sendptr, wait_send_size);
        }
        else
        {
            send_retlen = ::send(mSocket->getFD(), sendptr, wait_send_size, 0);
        }
#else
        send_retlen = ::send(mSocket->getFD(), sendptr, static_cast<int>(wait_send_size), 0);
#endif
        if (send_retlen <= 0)
        {

#ifdef USE_OPENSSL
            if ((mSSL != nullptr && SSL_get_error(mSSL, send_retlen) == SSL_ERROR_WANT_WRITE) ||
                (sErrno == S_EWOULDBLOCK))
            {
                mCanWrite = false;
                must_close = !checkWrite();
            }
            else
            {
                must_close = true;
            }
#else
            if (sErrno == S_EWOULDBLOCK)
            {
                mCanWrite = false;
                must_close = !checkWrite();
            }
            else
            {
                must_close = true;
            }
#endif
            break;
        }

        auto tmp_len = static_cast<size_t>(send_retlen);
        for (auto it = mSendList.begin(); it != mSendList.end();)
        {
            auto& packet = *it;
            if (packet.left > tmp_len)
            {
                packet.left -= tmp_len;
                break;
            }

            tmp_len -= packet.left;
            if (packet.mCompleteCallback != nullptr)
            {
                (packet.mCompleteCallback)();
            }
            it = mSendList.erase(it);
        }

        if (send_retlen != wait_send_size)
        {
            mCanWrite = false;
            must_close = !checkWrite();
            break;
        }
    }

    if (must_close)
    {
        procCloseInLoop();
    }
}